

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *__return_storage_ptr__,string *input)

{
  int iVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (split(std::__cxx11::string_const&)::delims_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&split(std::__cxx11::string_const&)::delims_abi_cxx11_);
    if (iVar1 != 0) {
      split(std::__cxx11::string_const&)::delims_abi_cxx11_._M_dataplus._M_p =
           (pointer)&split(std::__cxx11::string_const&)::delims_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&split(std::__cxx11::string_const&)::delims_abi_cxx11_," \t\n\f\r","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &split(std::__cxx11::string_const&)::delims_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&split(std::__cxx11::string_const&)::delims_abi_cxx11_);
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = std::__cxx11::string::find_first_not_of
                    ((char *)input,
                     (ulong)split(std::__cxx11::string_const&)::delims_abi_cxx11_._M_dataplus._M_p,0
                    );
  if (uVar2 != 0xffffffffffffffff) {
    do {
      uVar2 = std::__cxx11::string::find_first_of
                        ((char *)input,
                         (ulong)split(std::__cxx11::string_const&)::delims_abi_cxx11_._M_dataplus.
                                _M_p,uVar2);
      if (uVar2 == 0xffffffffffffffff) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)input);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_50);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)input);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_50);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar2 = std::__cxx11::string::find_first_not_of
                        ((char *)input,
                         (ulong)split(std::__cxx11::string_const&)::delims_abi_cxx11_._M_dataplus.
                                _M_p,uVar2);
    } while (uVar2 != 0xffffffffffffffff);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector <std::string> split (const std::string& input)
{
  static std::string delims = " \t\n\f\r";
  std::vector <std::string> results;

  std::string::size_type start = 0;
  std::string::size_type end;
  while ((start = input.find_first_not_of (delims, start)) != std::string::npos)
  {
    if ((end = input.find_first_of (delims, start)) != std::string::npos)
    {
      results.push_back (input.substr (start, end - start));
      start = end;
    }
    else
    {
      results.push_back (input.substr (start));
      start = std::string::npos;
    }
  }

  return results;
}